

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixMapfile(unixFile *pFd,i64 nMap)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  uint *puVar7;
  char *pcVar8;
  long lVar9;
  i64 nReuse;
  char *pcVar10;
  long in_FS_OFFSET;
  stat statbuf;
  undefined1 local_c8 [48];
  long local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pFd->nFetchOut < 1) {
    if (nMap < 0) {
      memset(local_c8,0xaa,0x90);
      iVar5 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_c8);
      iVar4 = 0x70a;
      nMap = local_98;
      if (iVar5 != 0) goto LAB_001338d0;
    }
    lVar2 = pFd->mmapSize;
    lVar9 = pFd->mmapSizeMax;
    if (nMap < pFd->mmapSizeMax) {
      lVar9 = nMap;
    }
    if (lVar9 != lVar2) {
      uVar1 = pFd->h;
      pvVar3 = pFd->pMapRegion;
      if (pvVar3 == (void *)0x0) {
        pcVar10 = "mmap";
LAB_001339b7:
        pvVar6 = (void *)(*aSyscall[0x16].pCurrent)(0,lVar9,1,1,(ulong)uVar1,0);
      }
      else {
        if (pFd->mmapSizeActual != lVar2) {
          (*aSyscall[0x17].pCurrent)(lVar2 + (long)pvVar3);
        }
        pvVar6 = (void *)(*aSyscall[0x18].pCurrent)(pvVar3,lVar2,lVar9,1);
        if ((long)pvVar6 + 1U < 2) {
          (*aSyscall[0x17].pCurrent)(pvVar3,lVar2);
          pcVar10 = "mremap";
          if (pvVar6 == (void *)0x0) goto LAB_001339b7;
        }
        else {
          pcVar10 = "mremap";
        }
      }
      if (pvVar6 == (void *)0xffffffffffffffff) {
        pcVar8 = pFd->zPath;
        puVar7 = (uint *)__errno_location();
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "";
        }
        pvVar6 = (void *)0x0;
        sqlite3_log(0,"os_unix.c:%d: (%d) %s(%s) - %s",0xabb1,(ulong)*puVar7,pcVar10,pcVar8,"");
        pFd->mmapSizeMax = 0;
        lVar9 = 0;
      }
      pFd->pMapRegion = pvVar6;
      pFd->mmapSizeActual = lVar9;
      pFd->mmapSize = lVar9;
    }
  }
  iVar4 = 0;
LAB_001338d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}